

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O2

error_or<int> * __thiscall
pstore::http::handle_version<ServeDynamicContent_Version_Test::TestBody()::__0,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          query_container *param_3)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  time_point time;
  undefined1 auVar4 [16];
  int local_204;
  string local_200;
  string local_1e0;
  span<const_unsigned_char,__1L> local_1c0;
  span<const_unsigned_char,__1L> local_1b0;
  ostringstream os;
  
  if (handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::version_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::version_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      poVar3 = std::operator<<((ostream *)&os,"{ \"version\": \"");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,'.');
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\" }");
      std::__cxx11::stringbuf::str();
      bVar1 = json::is_valid(&local_200);
      if (!bVar1) {
        assert_failed("json::is_valid (v)",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/serve_dynamic_content.hpp"
                      ,0x3a);
      }
      std::__cxx11::string::string
                ((string *)
                 &handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                  ::version_abi_cxx11_,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::version_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::version_abi_cxx11_);
    }
  }
  if ((char)handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
            ::modified == '\0') {
    iVar2 = __cxa_guard_acquire(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::modified);
    if (iVar2 != 0) {
      handle_version<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int>
      ::modified.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::modified);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<((ostream *)&os,"HTTP/1.1 200 OK");
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"Connection: close");
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"Content-length: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"Content-type: application/json");
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"Date: ");
  auVar4 = std::chrono::_V2::system_clock::now();
  http_date_abi_cxx11_(&local_200,auVar4._0_8_,(duration)auVar4._8_8_);
  poVar3 = std::operator<<(poVar3,(string *)&local_200);
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"Last-Modified: ");
  http_date_abi_cxx11_
            (&local_1e0,
             (http *)handle_version<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int>
                     ::modified.__d.__r,time);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"Server: ");
  poVar3 = std::operator<<(poVar3,"pstore-http");
  poVar3 = std::operator<<(poVar3,"\r\n");
  poVar3 = std::operator<<(poVar3,"\r\n");
  std::operator<<(poVar3,(string *)
                         &handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                          ::version_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringbuf::str();
  pstore::gsl::span<const_unsigned_char,_-1L>::span
            (&local_1b0,(pointer)local_200._M_dataplus._M_p,
             (pointer)(local_200._M_dataplus._M_p + local_200._M_string_length));
  local_204 = (int)sender.output;
  pstore::gsl::span<const_unsigned_char,_-1L>::begin((span<const_unsigned_char,__1L> *)&local_1e0);
  pstore::gsl::span<const_unsigned_char,_-1L>::end(&local_1c0);
  while ((local_1e0._M_dataplus._M_p != (pointer)local_1c0.storage_.super_extent_type<_1L>.size_ ||
         ((pointer)local_1e0._M_string_length != local_1c0.storage_.data_))) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
    operator*((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)&local_1e0);
    std::__cxx11::string::push_back((char)this);
    pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
    operator++((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)&local_1e0);
  }
  error_or<int>::error_or<int&,void>(__return_storage_ptr__,&local_204);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> handle_version (Sender sender, IO io, query_container const &) {
            auto version_string = [] () {
                std::ostringstream os;
                os << R"({ "version": ")" << header::major_version << '.' << header::minor_version
                   << "\" }";
                auto const & v = os.str ();
                PSTORE_ASSERT (json::is_valid (v));
                return v;
            };
            static std::string const version = version_string ();
            static auto const modified = std::chrono::system_clock::now ();

            std::ostringstream os;
            os << "HTTP/1.1 200 OK" << crlf                                         //
               << "Connection: close" << crlf                                       //
               << "Content-length: " << version.length () << crlf                   //
               << "Content-type: application/json" << crlf                          //
               << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
               << "Last-Modified: " << http_date (modified) << crlf                 //
               << "Server: " << server_name << crlf                                 //
               << crlf // End of headers
               << version;
            return pstore::http::send (sender, io, os.str ());
        }